

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_json.c
# Opt level: O2

gravity_value_t JSON_value(gravity_vm *vm,json_value *json)

{
  uint n;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar1;
  gravity_value_t *__ptr;
  gravity_class_t **ppgVar2;
  char *pcVar3;
  char *pcVar4;
  uint i;
  ulong uVar5;
  gravity_value_t gVar6;
  
  switch(json->type) {
  default:
    gVar6.field_1.n = 0;
    gVar6.isa = gravity_class_null;
    break;
  case json_object:
    aVar1.p = gravity_object_deserialize(vm,json);
    ppgVar2 = &(aVar1.p)->isa;
    if ((gravity_object_t *)aVar1.n == (gravity_object_t *)0x0) {
      ppgVar2 = &gravity_class_null;
    }
    gVar6.field_1.n = aVar1.n;
    gVar6.isa = ((gravity_object_t *)ppgVar2)->isa;
    break;
  case json_array:
    n = (json->u).string.length;
    aVar1.p = (gravity_object_t *)gravity_list_new(vm,n);
    for (uVar5 = 0; n != uVar5; uVar5 = uVar5 + 1) {
      gVar6 = JSON_value(vm,*(json_value **)((json->u).string.ptr + uVar5 * 8));
      pcVar3 = (char *)((gravity_value_r *)&(aVar1.p)->objclass)->n;
      __ptr = *(gravity_value_t **)&(aVar1.p)->has_outer;
      if (pcVar3 == (aVar1.p)->identifier) {
        pcVar4 = (char *)((long)pcVar3 * 2);
        if (pcVar3 == (char *)0x0) {
          pcVar4 = (char *)0x8;
        }
        (aVar1.p)->identifier = pcVar4;
        __ptr = (gravity_value_t *)realloc(__ptr,(long)pcVar4 << 4);
        *(gravity_value_t **)&(aVar1.p)->has_outer = __ptr;
        pcVar3 = (char *)((gravity_value_r *)&(aVar1.p)->objclass)->n;
      }
      ((gravity_value_r *)&(aVar1.p)->objclass)->n = (size_t)(pcVar3 + 1);
      __ptr[(long)pcVar3].isa = gVar6.isa;
      __ptr[(long)pcVar3].field_1.n = (gravity_int_t)gVar6.field_1;
    }
    gVar6.field_1.p = (gravity_object_t *)aVar1.n;
    gVar6.isa = (aVar1.p)->isa;
    break;
  case json_integer:
    ppgVar2 = &gravity_class_int;
    goto LAB_00132543;
  case json_double:
    ppgVar2 = &gravity_class_float;
LAB_00132543:
    gVar6.field_1 =
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(json->u).integer;
    gVar6.isa = *ppgVar2;
    break;
  case json_string:
    gVar6 = gravity_string_to_value(vm,(json->u).string.ptr,(json->u).string.length);
    break;
  case json_boolean:
    gVar6.field_1 =
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)(json->u).boolean;
    gVar6.isa = gravity_class_bool;
  }
  return gVar6;
}

Assistant:

static gravity_value_t JSON_value (gravity_vm *vm, json_value *json) {
    switch (json->type) {
        case json_none:
        case json_null:
            return VALUE_FROM_NULL;
            
        case json_object: {
            gravity_object_t *obj = gravity_object_deserialize(vm, json);
            gravity_value_t objv = (obj) ? VALUE_FROM_OBJECT(obj) : VALUE_FROM_NULL;
            return objv;
        }
            
        case json_array: {
            unsigned int length = json->u.array.length;
            gravity_list_t *list = gravity_list_new(vm, length);
            for (unsigned int i = 0; i < length; ++i) {
                gravity_value_t value = JSON_value(vm, json->u.array.values[i]);
                marray_push(gravity_value_t, list->array, value);
            }
            return VALUE_FROM_OBJECT(list);
        }
            
        case json_integer:
            return VALUE_FROM_INT(json->u.integer);
            
        case json_double:
            return VALUE_FROM_FLOAT(json->u.dbl);
            
        case json_string:
            return VALUE_FROM_STRING(vm, json->u.string.ptr, json->u.string.length);
            
        case json_boolean:
            return VALUE_FROM_BOOL(json->u.boolean);
    }
    
    return VALUE_FROM_NULL;
}